

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

int needa(char **p,char *c1,int r1,char *c2,int r2,char *c3,int r3,bool allowParenthesisEnd)

{
  int iVar1;
  bool allowParenthesisEnd_local;
  char *c3_local;
  int r2_local;
  char *c2_local;
  int r1_local;
  char *c1_local;
  char **p_local;
  
  iVar1 = isalpha((uint)(byte)**p);
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    iVar1 = cmphstr(p,c1,allowParenthesisEnd);
    p_local._4_4_ = r1;
    if ((iVar1 == 0) &&
       ((c2 == (char *)0x0 ||
        (iVar1 = cmphstr(p,c2,allowParenthesisEnd), p_local._4_4_ = r2, iVar1 == 0)))) {
      if ((c3 == (char *)0x0) || (iVar1 = cmphstr(p,c3,allowParenthesisEnd), iVar1 == 0)) {
        p_local._4_4_ = 0;
      }
      else {
        p_local._4_4_ = r3;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int needa(char*& p, const char* c1, int r1, const char* c2, int r2, const char* c3, int r3, bool allowParenthesisEnd) {
	//  SkipBlanks(p);
	if (!isalpha((byte)*p)) {
		return 0;
	}
	if (cmphstr(p, c1, allowParenthesisEnd)) {
		return r1;
	}
	if (c2 && cmphstr(p, c2, allowParenthesisEnd)) {
		return r2;
	}
	if (c3 && cmphstr(p, c3, allowParenthesisEnd)) {
		return r3;
	}
	return 0;
}